

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

void __thiscall
Lowerer::GenerateCachedTypeWithoutPropertyCheck
          (Lowerer *this,Instr *instrInsert,PropertySymOpnd *propertySymOpnd,Opnd *typeOpnd,
          LabelInstr *labelTypeCheckFailed)

{
  Sym *pSVar1;
  code *pcVar2;
  JITTypeHolderBase<void> type;
  bool bVar3;
  TypeId typeId;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  undefined4 *puVar7;
  JITType *pJVar8;
  RegOpnd *baseOpnd;
  IndirOpnd *src;
  Lowerer *this_00;
  AddrOpnd *compareSrc2;
  JITTimeFunctionBody *pJVar9;
  FunctionJITTimeInfo *pFVar10;
  WCHAR local_458 [4];
  WCHAR prefixValue [512];
  JITTypeHolderBase<void> local_40;
  JITTypeHolder typeWithoutProperty;
  
  if ((propertySymOpnd->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0) ||
     (bVar3 = ObjTypeSpecFldInfo::IsMonoObjTypeSpecCandidate(propertySymOpnd->objTypeSpecFldInfo),
     !bVar3)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1e9c,"(propertySymOpnd->IsMonoObjTypeSpecCandidate())",
                       "propertySymOpnd->IsMonoObjTypeSpecCandidate()");
    if (!bVar3) goto LAB_005ccafe;
    *puVar7 = 0;
  }
  bVar3 = IR::PropertySymOpnd::HasInitialType(propertySymOpnd);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1e9d,"(propertySymOpnd->HasInitialType())",
                       "propertySymOpnd->HasInitialType()");
    if (!bVar3) goto LAB_005ccafe;
    *puVar7 = 0;
  }
  local_40.t = (Type)IR::PropertySymOpnd::GetInitialType(propertySymOpnd);
  pJVar8 = JITTypeHolderBase<void>::operator->(&local_40);
  typeId = JITType::GetTypeId(pJVar8);
  bVar3 = Js::DynamicType::Is(typeId);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1ea2,"(Js::DynamicType::Is(typeWithoutProperty->GetTypeId()))",
                       "Js::DynamicType::Is(typeWithoutProperty->GetTypeId())");
    if (!bVar3) goto LAB_005ccafe;
    *puVar7 = 0;
  }
  typeWithoutProperty.t = (Type)instrInsert;
  if (typeOpnd == (Opnd *)0x0) {
    baseOpnd = IR::SymOpnd::CreatePropertyOwnerOpnd(&propertySymOpnd->super_SymOpnd,this->m_func);
    bVar3 = IR::Opnd::IsNotTaggedValue(&baseOpnd->super_Opnd);
    if (!bVar3) {
      LowererMD::GenerateObjectTest
                (&this->m_lowererMD,&baseOpnd->super_Opnd,instrInsert,labelTypeCheckFailed,false);
    }
    src = IR::IndirOpnd::New(baseOpnd,8,TyInt64,this->m_func,false);
    typeOpnd = &IR::RegOpnd::New(TyInt64,this->m_func)->super_Opnd;
    instrInsert = (Instr *)typeWithoutProperty;
    InsertMove(typeOpnd,&src->super_Opnd,(Instr *)typeWithoutProperty.t,true);
  }
  this_00 = (Lowerer *)
            CreateTypePropertyGuardForGuardedProperties
                      (this,(JITTypeHolder)local_40.t,propertySymOpnd);
  if (this_00 == (Lowerer *)0x0) {
    pJVar8 = JITTypeHolderBase<void>::operator->(&local_40);
    this_00 = (Lowerer *)JITType::GetAddr(pJVar8);
    compareSrc2 = IR::AddrOpnd::New((intptr_t)this_00,AddrOpndKindDynamicType,this->m_func,true,
                                    (Var)0x0);
  }
  else {
    compareSrc2 = (AddrOpnd *)
                  IR::MemRefOpnd::New(this_00,TyUint64,this->m_func,AddrOpndKindDynamicGuardValueRef
                                     );
    if (DAT_015bc46a == '\x01') {
      pJVar9 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
      uVar4 = JITTimeFunctionBody::GetSourceContextId(pJVar9);
      pFVar10 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
      uVar5 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar10);
      this_00 = (Lowerer *)&DAT_015b6718;
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,ObjTypeSpecPhase,uVar4,uVar5);
      instrInsert = (Instr *)typeWithoutProperty;
      if (bVar3) {
        pJVar9 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
        prefixValue._1016_8_ = JITTimeFunctionBody::GetDisplayName(pJVar9);
        pJVar9 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
        uVar4 = JITTimeFunctionBody::GetSourceContextId(pJVar9);
        pFVar10 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
        uVar5 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar10);
        pJVar9 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
        uVar6 = JITTimeFunctionBody::GetFunctionNumber(pJVar9);
        swprintf_s<512ul>((WCHAR (*) [512])local_458,L"%s (#%d.%u, #%u)",prefixValue._1016_8_,
                          (ulong)uVar4,(ulong)uVar5,(ulong)uVar6);
        pJVar8 = JITTypeHolderBase<void>::operator->(&local_40);
        JITType::GetAddr(pJVar8);
        this_00 = (Lowerer *)0x84;
        Output::TraceWithPrefix
                  (ObjTypeSpecPhase,local_458,L"Emitted %s type check for type 0x%p.\n",L"indirect")
        ;
        instrInsert = (Instr *)typeWithoutProperty;
      }
    }
  }
  InsertCompareBranch(this_00,typeOpnd,&compareSrc2->super_Opnd,BrNeq_A,false,labelTypeCheckFailed,
                      instrInsert,false);
  type.t = (Type)local_40;
  pSVar1 = (propertySymOpnd->super_SymOpnd).m_sym;
  if (pSVar1->m_kind != SymKindProperty) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                       ,0x43,"(this->IsPropertySym())","Bad call to AsPropertySym()");
    if (!bVar3) {
LAB_005ccafe:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
    instrInsert = (Instr *)typeWithoutProperty;
  }
  PinTypeRef(this,(JITTypeHolder)type.t,type.t,instrInsert,*(PropertyId *)&pSVar1[1]._vptr_Sym);
  return;
}

Assistant:

void
Lowerer::GenerateCachedTypeWithoutPropertyCheck(IR::Instr *instrInsert, IR::PropertySymOpnd *propertySymOpnd, IR::Opnd *typeOpnd, IR::LabelInstr *labelTypeCheckFailed)
{
    Assert(propertySymOpnd->IsMonoObjTypeSpecCandidate());
    Assert(propertySymOpnd->HasInitialType());

    JITTypeHolder typeWithoutProperty = propertySymOpnd->GetInitialType();

    // We should never add properties to objects of static types.
    Assert(Js::DynamicType::Is(typeWithoutProperty->GetTypeId()));

    if (typeOpnd == nullptr)
    {
        // No opnd holding the type was passed in, so we have to load the type here.
        IR::RegOpnd *baseOpnd = propertySymOpnd->CreatePropertyOwnerOpnd(m_func);
        if (!baseOpnd->IsNotTaggedValue())
        {
            m_lowererMD.GenerateObjectTest(baseOpnd, instrInsert, labelTypeCheckFailed);
        }
        IR::Opnd *opnd = IR::IndirOpnd::New(baseOpnd, Js::RecyclableObject::GetOffsetOfType(), TyMachReg, this->m_func);
        typeOpnd = IR::RegOpnd::New(TyMachReg, this->m_func);
        InsertMove(typeOpnd, opnd, instrInsert);
    }

    Js::JitTypePropertyGuard* typePropertyGuard = CreateTypePropertyGuardForGuardedProperties(typeWithoutProperty, propertySymOpnd);

    IR::Opnd *expectedTypeOpnd;

    if (typePropertyGuard)
    {
        bool emitDirectCheck = true;

        Assert(typePropertyGuard != nullptr);
        Assert(Js::PropertyGuard::GetSizeOfValue() == static_cast<size_t>(TySize[TyMachPtr]));

        if (this->m_func->IsOOPJIT())
        {
            int typeCheckGuardOffset = NativeCodeData::GetDataTotalOffset(typePropertyGuard);
            expectedTypeOpnd = IR::IndirOpnd::New(IR::RegOpnd::New(m_func->GetTopFunc()->GetNativeCodeDataSym(), TyVar, m_func), typeCheckGuardOffset, TyMachPtr,
#if DBG
                NativeCodeData::GetDataDescription(typePropertyGuard, this->m_func->m_alloc),
#endif
                this->m_func, true);

            this->addToLiveOnBackEdgeSyms->Set(m_func->GetTopFunc()->GetNativeCodeDataSym()->m_id);
        }
        else
        {
            expectedTypeOpnd = IR::MemRefOpnd::New((void*)(typePropertyGuard->GetAddressOfValue()), TyMachPtr, this->m_func, IR::AddrOpndKindDynamicGuardValueRef);
        }

        emitDirectCheck = false;

        OUTPUT_VERBOSE_TRACE_FUNC(Js::ObjTypeSpecPhase, this->m_func, _u("Emitted %s type check for type 0x%p.\n"),
            emitDirectCheck ? _u("direct") : _u("indirect"), typeWithoutProperty->GetAddr());
    }
    else
    {
        expectedTypeOpnd = IR::AddrOpnd::New(typeWithoutProperty->GetAddr(), IR::AddrOpndKindDynamicType, m_func, true);
    }

    InsertCompareBranch(typeOpnd, expectedTypeOpnd, Js::OpCode::BrNeq_A, labelTypeCheckFailed, instrInsert);

    // Technically, it should be enough to pin the final type, because it should keep all of its predecessors alive, but
    // just to be extra cautious, let's pin the initial type as well.
    PinTypeRef(typeWithoutProperty, typeWithoutProperty.t, instrInsert, propertySymOpnd->m_sym->AsPropertySym()->m_propertyId);
}